

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

char * dict_to_string(ObjDict *dict)

{
  HTKeyType HVar1;
  void *__src;
  String *previous;
  bool bVar2;
  char *pcVar3;
  size_t length;
  ulong uVar4;
  long lVar5;
  long lVar6;
  HTItem *pHVar7;
  long lVar8;
  char *unaff_R14;
  char *key;
  CrispyValue value;
  size_t sStack_80;
  StringArray local_68;
  HTItem **local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  char *val;
  
  HVar1 = (dict->content).key_type;
  local_50 = (ulong)(dict->content).cap;
  local_58 = (dict->content).buckets;
  local_68.count = 0;
  local_68.cap = 0;
  local_68.strings = (String *)0x0;
  bVar2 = true;
  local_40 = (ulong)HVar1;
  uVar4 = 0;
  lVar6 = 0;
  do {
    if (uVar4 == local_50) {
      pcVar3 = (char *)malloc(lVar6 + 3);
      previous = local_68.strings;
      uVar4 = local_68._0_8_ & 0xffffffff;
      lVar8 = 1;
      for (lVar5 = 0; uVar4 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
        __src = *(void **)((long)&previous->start + lVar5);
        memcpy(pcVar3 + lVar8,__src,*(size_t *)((long)&previous->length + lVar5));
        free(__src);
        lVar8 = lVar8 + *(long *)((long)&previous->length + lVar5);
      }
      *pcVar3 = '{';
      (pcVar3 + lVar6 + 1)[0] = '}';
      (pcVar3 + lVar6 + 1)[1] = '\0';
      reallocate(previous,0);
      return pcVar3;
    }
    local_48 = uVar4;
    for (pHVar7 = local_58[uVar4]; pHVar7 != (HTItem *)0x0; pHVar7 = pHVar7->next) {
      if (bVar2) {
        pcVar3 = strdup("\"");
        sStack_80 = 1;
      }
      else {
        pcVar3 = strdup(", \"");
        sStack_80 = 3;
      }
      write_string(&local_68,pcVar3,sStack_80);
      if (HVar1 < 4) {
        pcVar3 = (char *)(*(code *)(&DAT_001073a8 + *(int *)(&DAT_001073a8 + local_40 * 4)))();
        return pcVar3;
      }
      write_string(&local_68,unaff_R14,0);
      pcVar3 = strdup("\": ");
      write_string(&local_68,pcVar3,3);
      value._4_4_ = 0;
      value.type = (pHVar7->value).type;
      value.field_1.p_value = (pHVar7->value).field_1.p_value;
      length = value_to_string(value,&val);
      write_string(&local_68,val,length);
      lVar6 = lVar6 + sStack_80 + length + 3;
      bVar2 = false;
    }
    uVar4 = local_48 + 1;
  } while( true );
}

Assistant:

char *dict_to_string(ObjDict *dict) {
    HashTable ht = dict->content;
    StringArray str_arr;
    init_string_array(&str_arr);

    size_t size = 0;
    size_t temp_size;

    bool first = true;

    for (uint32_t i = 0; i < ht.cap; ++i) {
        HTItem *bucket = ht.buckets[i];
        while (bucket) {
            if (first) {
                first = false;
                write_string(&str_arr, strdup("\""), 1);
                size += 1;
            } else {
                write_string(&str_arr, strdup(", \""), 3);
                size += 3;
            }

            char *key;
            temp_size = ht_key_to_string(ht.key_type, bucket->key, &key);
            write_string(&str_arr, key, temp_size);
            size += temp_size;

            size += 3;
            write_string(&str_arr, strdup("\": "), 3);

            char *val;
            temp_size = value_to_string(bucket->value, &val);
            write_string(&str_arr, val, temp_size);
            size += temp_size;

            bucket = bucket->next;
        }
    }

    char *string = malloc((size + 3)* sizeof(char));
    size_t offset = 1;

    for (uint32_t j = 0; j < str_arr.count; ++j) {
        String *s = &str_arr.strings[j];
        memcpy(string + offset, s->start, s->length);
        free(str_arr.strings[j].start);
        offset += s->length;
    }

    string[0] = '{';
    string[size + 1] = '}';
    string[size + 2] = '\0';

    free_string_array(&str_arr);

    return string;
}